

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int qtree_encode(char *outfile,int *a,int n,int nqx,int nqy,int nbitplanes)

{
  int bmax_00;
  int iVar1;
  uchar *b_00;
  uchar *buffer_00;
  double dVar2;
  double dVar3;
  int local_74;
  uchar *buffer;
  uchar *scratch;
  int local_58;
  int ny;
  int nx;
  int nqy2;
  int nqx2;
  int nqmax;
  int bmax;
  int b;
  int bit;
  int k;
  int i;
  int log2n;
  int nbitplanes_local;
  int nqy_local;
  int nqx_local;
  int n_local;
  int *a_local;
  char *outfile_local;
  
  local_74 = nqy;
  if (nqy < nqx) {
    local_74 = nqx;
  }
  i = nbitplanes;
  log2n = nqy;
  nbitplanes_local = nqx;
  nqy_local = n;
  _nqx_local = a;
  a_local = (int *)outfile;
  dVar2 = log((double)local_74);
  dVar3 = log(2.0);
  k = (int)(dVar2 / dVar3 + 0.5);
  if (1 << ((byte)k & 0x1f) < local_74) {
    k = k + 1;
  }
  bmax_00 = (((nbitplanes_local + 1) / 2) * ((log2n + 1) / 2) + 1) / 2;
  b_00 = (uchar *)malloc((long)(bmax_00 << 1));
  buffer_00 = (uchar *)malloc((long)bmax_00);
  if ((b_00 == (uchar *)0x0) || (bmax = i, buffer_00 == (uchar *)0x0)) {
    ffpmsg("qtree_encode: insufficient memory");
    outfile_local._4_4_ = 0x19d;
  }
  else {
LAB_001ab95c:
    bmax = bmax + -1;
    if (-1 < bmax) {
      nqmax = 0;
      bitbuffer = 0;
      bits_to_go3 = 0;
      qtree_onebit(_nqx_local,nqy_local,nbitplanes_local,log2n,b_00,bmax);
      local_58 = nbitplanes_local + 1 >> 1;
      scratch._4_4_ = log2n + 1 >> 1;
      iVar1 = bufcopy(b_00,local_58 * scratch._4_4_,buffer_00,&nqmax,bmax_00);
      if (iVar1 == 0) {
        for (b = 1; b < k; b = b + 1) {
          qtree_reduce(b_00,scratch._4_4_,local_58,scratch._4_4_,b_00);
          local_58 = local_58 + 1 >> 1;
          scratch._4_4_ = scratch._4_4_ + 1 >> 1;
          iVar1 = bufcopy(b_00,local_58 * scratch._4_4_,buffer_00,&nqmax,bmax_00);
          if (iVar1 != 0) {
            write_bdirect((char *)a_local,_nqx_local,nqy_local,nbitplanes_local,log2n,b_00,bmax);
            goto LAB_001ab95c;
          }
        }
        output_nybble((char *)a_local,0xf);
        if (nqmax == 0) {
          if (bits_to_go3 < 1) {
            output_nbits((char *)a_local,code[0],ncode[0]);
          }
          else {
            output_nbits((char *)a_local,bitbuffer & (1 << ((byte)bits_to_go3 & 0x1f)) - 1U,
                         bits_to_go3);
          }
        }
        else {
          iVar1 = nqmax;
          if (0 < bits_to_go3) {
            output_nbits((char *)a_local,bitbuffer & (1 << ((byte)bits_to_go3 & 0x1f)) - 1U,
                         bits_to_go3);
            iVar1 = nqmax;
          }
          while (bit = iVar1 + -1, -1 < bit) {
            output_nbits((char *)a_local,(uint)buffer_00[bit],8);
            iVar1 = bit;
          }
        }
      }
      else {
        write_bdirect((char *)a_local,_nqx_local,nqy_local,nbitplanes_local,log2n,b_00,bmax);
      }
      goto LAB_001ab95c;
    }
    free(buffer_00);
    free(b_00);
    outfile_local._4_4_ = 0;
  }
  return outfile_local._4_4_;
}

Assistant:

static int
qtree_encode(char *outfile, int a[], int n, int nqx, int nqy, int nbitplanes)
{

/*
int a[];
int n;								 physical dimension of row in a		
int nqx;							 length of row			
int nqy;							 length of column (<=n)				
int nbitplanes;						 number of bit planes to output	
*/
	
int log2n, i, k, bit, b, bmax, nqmax, nqx2, nqy2, nx, ny;
unsigned char *scratch, *buffer;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * initialize buffer point, max buffer size
	 */
	nqx2 = (nqx+1)/2;
	nqy2 = (nqy+1)/2;
	bmax = (nqx2*nqy2+1)/2;
	/*
	 * We're indexing A as a 2-D array with dimensions (nqx,nqy).
	 * Scratch is 2-D with dimensions (nqx/2,nqy/2) rounded up.
	 * Buffer is used to store string of codes for output.
	 */
	scratch = (unsigned char *) malloc(2*bmax);
	buffer = (unsigned char *) malloc(bmax);
	if ((scratch == (unsigned char *) NULL) ||
		(buffer  == (unsigned char *) NULL)) {		
		ffpmsg("qtree_encode: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	/*
	 * now encode each bit plane, starting with the top
	 */
	for (bit=nbitplanes-1; bit >= 0; bit--) {
		/*
		 * initial bit buffer
		 */
		b = 0;
		bitbuffer = 0;
		bits_to_go3 = 0;
		/*
		 * on first pass copy A to scratch array
		 */
		qtree_onebit(a,n,nqx,nqy,scratch,bit);
		nx = (nqx+1)>>1;
		ny = (nqy+1)>>1;
		/*
		 * copy non-zero values to output buffer, which will be written
		 * in reverse order
		 */
		if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
			/*
			 * quadtree is expanding data,
			 * change warning code and just fill buffer with bit-map
			 */
			write_bdirect(outfile,a,n,nqx,nqy,scratch,bit);
			goto bitplane_done;
		}
		/*
		 * do log2n reductions
		 */
		for (k = 1; k<log2n; k++) {
			qtree_reduce(scratch,ny,nx,ny,scratch);
			nx = (nx+1)>>1;
			ny = (ny+1)>>1;
			if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
				write_bdirect(outfile,a,n,nqx,nqy,scratch,bit);
				goto bitplane_done;
			}
		}
		/*
		 * OK, we've got the code in buffer
		 * Write quadtree warning code, then write buffer in reverse order
		 */
		output_nybble(outfile,0xF);
		if (b==0) {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			} else {
				/*
				 * have to write a zero nybble if there are no 1's in array
				 */
				output_huffman(outfile,0);
			}
		} else {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			}
			for (i=b-1; i>=0; i--) {
				output_nbits(outfile,buffer[i],8);
			}
		}
		bitplane_done: ;
	}
	free(buffer);
	free(scratch);
	return(0);
}